

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Printer.cxx
# Opt level: O0

void __thiscall Fl_Printer::Fl_Printer(Fl_Printer *this)

{
  Fl_PostScript_Printer *this_00;
  Fl_PostScript_Graphics_Driver *graphics_driver;
  Fl_Printer *this_local;
  
  Fl_Paged_Device::Fl_Paged_Device(&this->super_Fl_Paged_Device);
  (this->super_Fl_Paged_Device).super_Fl_Surface_Device.super_Fl_Device._vptr_Fl_Device =
       (_func_int **)&PTR_class_name_002ecf10;
  this_00 = (Fl_PostScript_Printer *)operator_new(0x18);
  Fl_PostScript_Printer::Fl_PostScript_Printer(this_00);
  this->printer = this_00;
  graphics_driver =
       Fl_PostScript_File_Device::driver(&this->printer->super_Fl_PostScript_File_Device);
  Fl_Surface_Device::driver((Fl_Surface_Device *)this,&graphics_driver->super_Fl_Graphics_Driver);
  return;
}

Assistant:

Fl_Printer::Fl_Printer(void) {
#if defined(WIN32) || defined(__APPLE__)
  printer = new Fl_System_Printer();
#else
  printer = new Fl_PostScript_Printer();
#endif
  Fl_Surface_Device::driver(printer->driver());
}